

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

uchar * ensure(printbuffer *p,size_t needed)

{
  ulong uVar1;
  size_t local_30;
  size_t newsize;
  uchar *newbuffer;
  size_t needed_local;
  printbuffer *p_local;
  
  if ((p == (printbuffer *)0x0) || (p->buffer == (uchar *)0x0)) {
    p_local = (printbuffer *)0x0;
  }
  else if ((p->length == 0) || (p->offset < p->length)) {
    if (needed < 0x80000000) {
      uVar1 = p->offset + 1 + needed;
      if (p->length < uVar1) {
        if (p->noalloc == 0) {
          if (uVar1 < 0x40000000) {
            local_30 = uVar1 * 2;
          }
          else {
            if (0x7fffffff < uVar1) {
              return (uchar *)0x0;
            }
            local_30 = 0x7fffffff;
          }
          if ((p->hooks).reallocate == (_func_void_ptr_void_ptr_size_t *)0x0) {
            newsize = (size_t)(*(p->hooks).allocate)(local_30);
            if ((void *)newsize == (void *)0x0) {
              (*(p->hooks).deallocate)(p->buffer);
              p->length = 0;
              p->buffer = (uchar *)0x0;
              return (uchar *)0x0;
            }
            memcpy((void *)newsize,p->buffer,p->offset + 1);
            (*(p->hooks).deallocate)(p->buffer);
          }
          else {
            newsize = (size_t)(*(p->hooks).reallocate)(p->buffer,local_30);
            if ((void *)newsize == (void *)0x0) {
              (*(p->hooks).deallocate)(p->buffer);
              p->length = 0;
              p->buffer = (uchar *)0x0;
              return (uchar *)0x0;
            }
          }
          p->length = local_30;
          p->buffer = (uchar *)newsize;
          p_local = (printbuffer *)(newsize + p->offset);
        }
        else {
          p_local = (printbuffer *)0x0;
        }
      }
      else {
        p_local = (printbuffer *)(p->buffer + p->offset);
      }
    }
    else {
      p_local = (printbuffer *)0x0;
    }
  }
  else {
    p_local = (printbuffer *)0x0;
  }
  return (uchar *)p_local;
}

Assistant:

static unsigned char* ensure(printbuffer * const p, size_t needed)
{
    unsigned char *newbuffer = NULL;
    size_t newsize = 0;

    if ((p == NULL) || (p->buffer == NULL))
    {
        return NULL;
    }

    if ((p->length > 0) && (p->offset >= p->length))
    {
        /* make sure that offset is valid */
        return NULL;
    }

    if (needed > INT_MAX)
    {
        /* sizes bigger than INT_MAX are currently not supported */
        return NULL;
    }

    needed += p->offset + 1;
    if (needed <= p->length)
    {
        return p->buffer + p->offset;
    }

    if (p->noalloc) {
        return NULL;
    }

    /* calculate new buffer size */
    if (needed > (INT_MAX / 2))
    {
        /* overflow of int, use INT_MAX if possible */
        if (needed <= INT_MAX)
        {
            newsize = INT_MAX;
        }
        else
        {
            return NULL;
        }
    }
    else
    {
        newsize = needed * 2;
    }

    if (p->hooks.reallocate != NULL)
    {
        /* reallocate with realloc if available */
        newbuffer = (unsigned char*)p->hooks.reallocate(p->buffer, newsize);
        if (newbuffer == NULL)
        {
            p->hooks.deallocate(p->buffer);
            p->length = 0;
            p->buffer = NULL;

            return NULL;
        }
    }
    else
    {
        /* otherwise reallocate manually */
        newbuffer = (unsigned char*)p->hooks.allocate(newsize);
        if (!newbuffer)
        {
            p->hooks.deallocate(p->buffer);
            p->length = 0;
            p->buffer = NULL;

            return NULL;
        }

        memcpy(newbuffer, p->buffer, p->offset + 1);
        p->hooks.deallocate(p->buffer);
    }
    p->length = newsize;
    p->buffer = newbuffer;

    return newbuffer + p->offset;
}